

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsIndiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  AdjacencyGrid *pAVar4;
  AdjacencyGridPoint *pAVar5;
  GLfloat *pGVar6;
  GLfloat *pGVar7;
  uint *puVar8;
  GLfloat *pGVar9;
  GLfloat *pGVar10;
  uint *puVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  pAVar4 = test_data->m_grid;
  uVar2 = (pAVar4->m_line_strip).m_n_points;
  test_data->m_n_vertices = uVar2;
  uVar15 = (uVar2 * 8 + -0x18) * this->m_n_components_output;
  test_data->m_geometry_bo_size = uVar15;
  uVar16 = uVar2 * 4;
  uVar14 = this->m_n_components_input * uVar16;
  test_data->m_vertex_data_bo_size = uVar14;
  test_data->m_index_data_bo_size = uVar16;
  pGVar6 = (GLfloat *)operator_new__((ulong)uVar15);
  test_data->m_expected_adjacency_geometry = pGVar6;
  pGVar7 = (GLfloat *)operator_new__((ulong)uVar15);
  test_data->m_expected_geometry = pGVar7;
  puVar8 = (uint *)operator_new__((ulong)uVar16);
  test_data->m_index_data = puVar8;
  pGVar9 = (GLfloat *)operator_new__((ulong)uVar14);
  test_data->m_vertex_data = pGVar9;
  if ((ulong)uVar2 != 0) {
    pGVar10 = &((pAVar4->m_line_strip).m_points)->y;
    uVar12 = 0;
    do {
      pGVar9[uVar12 * 2] = pGVar10[-1];
      pGVar9[uVar12 * 2 + 1] = *pGVar10;
      uVar12 = uVar12 + 1;
      pGVar10 = pGVar10 + 3;
      puVar11 = puVar8;
      uVar14 = uVar2;
    } while (uVar2 != uVar12);
    do {
      uVar14 = uVar14 - 1;
      *puVar11 = uVar14;
      puVar11 = puVar11 + 1;
    } while (uVar14 != 0);
  }
  if (uVar2 - 3 != 0) {
    pAVar5 = (pAVar4->m_line_strip).m_points;
    uVar12 = 3;
    lVar13 = 0;
    do {
      uVar14 = puVar8[uVar12 - 3];
      uVar15 = puVar8[uVar12 - 2];
      uVar16 = puVar8[(int)uVar12 - 1];
      uVar3 = puVar8[uVar12 & 0xffffffff];
      *(GLfloat *)((long)pGVar6 + lVar13) = pAVar5[uVar14].x;
      *(GLfloat *)((long)pGVar6 + lVar13 + 4) = pAVar5[uVar14].y;
      *(undefined8 *)((long)pGVar6 + lVar13 + 8) = 0x3f80000000000000;
      *(GLfloat *)((long)pGVar6 + lVar13 + 0x10) = pAVar5[uVar3].x;
      *(GLfloat *)((long)pGVar6 + lVar13 + 0x14) = pAVar5[uVar3].y;
      *(undefined8 *)((long)pGVar6 + lVar13 + 0x18) = 0x3f80000000000000;
      *(GLfloat *)((long)pGVar7 + lVar13) = pAVar5[uVar15].x;
      *(GLfloat *)((long)pGVar7 + lVar13 + 4) = pAVar5[uVar15].y;
      *(undefined8 *)((long)pGVar7 + lVar13 + 8) = 0x3f80000000000000;
      *(GLfloat *)((long)pGVar7 + lVar13 + 0x10) = pAVar5[uVar16].x;
      *(GLfloat *)((long)pGVar7 + lVar13 + 0x14) = pAVar5[uVar16].y;
      *(undefined8 *)((long)pGVar7 + lVar13 + 0x18) = 0x3f80000000000000;
      lVar1 = uVar12 - (uVar2 - 3);
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x20;
    } while (lVar1 != 2);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsIndiced(AdjacencyTestData& test_data)
{

	float*		  travellerExpectedAdjacencyGeometryPtr = 0;
	float*		  travellerExpectedGeometryPtr			= 0;
	unsigned int* travellerIndicesPtr					= 0;
	float*		  travellerPtr							= 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));
	test_data.m_index_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * sizeof(unsigned int));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_index_data					= new unsigned int[test_data.m_index_data_bo_size / sizeof(unsigned int)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerIndicesPtr					  = test_data.m_index_data;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected value s*/
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerIndicesPtr = (test_data.m_n_vertices - n - 1);
		++travellerIndicesPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		AdjacencyGridPoint* pointN0 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n];
		AdjacencyGridPoint* pointN1 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 1];
		AdjacencyGridPoint* pointN2 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 2];
		AdjacencyGridPoint* pointN3 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 3];

		*travellerExpectedAdjacencyGeometryPtr = pointN0->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN0->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = pointN1->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN1->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices apart from the three last ones) */
}